

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

void lj_buf_shrink(lua_State *L,SBuf *sb)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  MSize n;
  MSize osz;
  char *b;
  SBuf *sb_local;
  lua_State *L_local;
  
  iVar2 = (int)sb->b;
  uVar3 = (int)sb->e - iVar2;
  if (0x40 < uVar3) {
    pcVar1 = sb->w;
    pcVar4 = (char *)lj_mem_realloc(L,sb->b,(ulong)uVar3,(ulong)(uVar3 >> 1));
    sb->b = pcVar4;
    sb->w = pcVar4 + (uint)((int)pcVar1 - iVar2);
    sb->e = pcVar4 + (uVar3 >> 1);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_buf_shrink(lua_State *L, SBuf *sb)
{
  char *b = sb->b;
  MSize osz = (MSize)(sb->e - b);
  if (osz > 2*LJ_MIN_SBUF) {
    MSize n = (MSize)(sb->w - b);
    b = lj_mem_realloc(L, b, osz, (osz >> 1));
    sb->b = b;
    sb->w = b + n;
    sb->e = b + (osz >> 1);
  }
  lj_assertG_(G(sbufL(sb)), !sbufisext(sb), "YAGNI shrink SBufExt");
}